

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_binary_packed_decoder.cpp
# Opt level: O2

void __thiscall duckdb::DeltaBinaryPackedDecoder::InitializePage(DeltaBinaryPackedDecoder *this)

{
  __uniq_ptr_impl<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_> __p;
  tuple<duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_> in_RAX;
  ResizeableBuffer *pRVar1;
  ResizeableBuffer *pRVar2;
  shared_ptr<duckdb::ResizeableBuffer,_true> *this_00;
  __uniq_ptr_impl<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_> local_28;
  
  this_00 = &this->reader->block;
  local_28._M_t.
  super__Tuple_impl<0UL,_duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>.
  super__Head_base<0UL,_duckdb::DbpDecoder_*,_false>._M_head_impl =
       (tuple<duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>)
       (tuple<duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>)
       in_RAX.super__Tuple_impl<0UL,_duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>
       .super__Head_base<0UL,_duckdb::DbpDecoder_*,_false>._M_head_impl;
  pRVar1 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  pRVar2 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  make_uniq<duckdb::DbpDecoder,unsigned_char*&,unsigned_long&>
            ((duckdb *)&local_28,(uchar **)pRVar1,&(pRVar2->super_ByteBuffer).len);
  __p._M_t.super__Tuple_impl<0UL,_duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>.
  super__Head_base<0UL,_duckdb::DbpDecoder_*,_false>._M_head_impl =
       local_28._M_t.
       super__Tuple_impl<0UL,_duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>.
       super__Head_base<0UL,_duckdb::DbpDecoder_*,_false>._M_head_impl;
  local_28._M_t.
  super__Tuple_impl<0UL,_duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>.
  super__Head_base<0UL,_duckdb::DbpDecoder_*,_false>._M_head_impl =
       (tuple<duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>)
       (_Tuple_impl<0UL,_duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>::reset
            ((__uniq_ptr_impl<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_> *)
             &this->dbp_decoder,
             (pointer)__p._M_t.
                      super__Tuple_impl<0UL,_duckdb::DbpDecoder_*,_std::default_delete<duckdb::DbpDecoder>_>
                      .super__Head_base<0UL,_duckdb::DbpDecoder_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_>::~unique_ptr
            ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>_> *)&local_28);
  pRVar1 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  pRVar2 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  ByteBuffer::inc(&pRVar1->super_ByteBuffer,(pRVar2->super_ByteBuffer).len);
  return;
}

Assistant:

void DeltaBinaryPackedDecoder::InitializePage() {
	auto &block = reader.block;
	dbp_decoder = make_uniq<DbpDecoder>(block->ptr, block->len);
	block->inc(block->len);
}